

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void ClipperLib::SwapIntersectNodes(IntersectNode *int1,IntersectNode *int2)

{
  long64 lVar1;
  long64 lVar2;
  TEdge *pTVar3;
  TEdge *pTVar4;
  long64 lVar5;
  IntPoint p;
  
  lVar1 = (int1->pt).X;
  lVar2 = (int1->pt).Y;
  pTVar3 = int1->edge1;
  pTVar4 = int1->edge2;
  int1->edge1 = int2->edge1;
  int1->edge2 = int2->edge2;
  lVar5 = (int2->pt).Y;
  (int1->pt).X = (int2->pt).X;
  (int1->pt).Y = lVar5;
  int2->edge1 = pTVar3;
  int2->edge2 = pTVar4;
  (int2->pt).X = lVar1;
  (int2->pt).Y = lVar2;
  return;
}

Assistant:

void SwapIntersectNodes(IntersectNode &int1, IntersectNode &int2)
{
  TEdge *e1 = int1.edge1;
  TEdge *e2 = int1.edge2;
  IntPoint p = int1.pt;

  int1.edge1 = int2.edge1;
  int1.edge2 = int2.edge2;
  int1.pt = int2.pt;

  int2.edge1 = e1;
  int2.edge2 = e2;
  int2.pt = p;
}